

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_NtkCreateLevels(Wlc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  int local_1c;
  int LeveMax;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_NtkObjNumMax(p);
  Vec_IntFill(&p->vLevels,iVar1,0);
  for (local_1c = 1; iVar1 = Wlc_NtkObjNumMax(p), local_1c < iVar1; local_1c = local_1c + 1) {
    pWVar3 = Wlc_NtkObj(p,local_1c);
    Wlc_NtkCreateLevels_rec(p,pWVar3);
  }
  for (local_1c = 1; iVar1 = Wlc_NtkObjNumMax(p), local_1c < iVar1; local_1c = local_1c + 1) {
    pWVar3 = Wlc_NtkObj(p,local_1c);
    iVar1 = Wlc_ObjIsCi(pWVar3);
    if ((iVar1 == 0) && (iVar1 = Wlc_ObjFaninNum(pWVar3), iVar1 != 0)) {
      Vec_IntAddToEntry(&p->vLevels,local_1c,1);
    }
  }
  iVar1 = Vec_IntFindMax(&p->vLevels);
  for (local_1c = 0; iVar2 = Vec_IntSize(&p->vFfs2), local_1c < iVar2; local_1c = local_1c + 1) {
    pWVar3 = Wlc_NtkFf2(p,local_1c);
    iVar2 = Wlc_ObjId(p,pWVar3);
    Vec_IntWriteEntry(&p->vLevels,iVar2,iVar1 + 1);
  }
  return iVar1 + 1;
}

Assistant:

int Wlc_NtkCreateLevels( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;  int i, LeveMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
        Wlc_NtkCreateLevels_rec( p, pObj );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( !Wlc_ObjIsCi(pObj) && Wlc_ObjFaninNum(pObj) )
            Vec_IntAddToEntry( &p->vLevels, i, 1 );
    LeveMax = Vec_IntFindMax( &p->vLevels );
    Wlc_NtkForEachFf2( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, Wlc_ObjId(p, pObj), LeveMax+1 );
    //Wlc_NtkPrintObjects( p ); 
    return LeveMax+1;
}